

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

int stat_make_tree(nni_stat_item *item,nni_stat **sp)

{
  nni_stat *pnVar1;
  int iVar2;
  nni_stat *st;
  nni_stat_item *item_00;
  nni_stat *local_40;
  nni_stat *cs;
  
  st = (nni_stat *)nni_zalloc(0x50);
  if (st == (nni_stat *)0x0) {
    iVar2 = 2;
  }
  else {
    cs = (nni_stat *)sp;
    nni_list_init_offset(&st->s_children,0x30);
    st->s_info = item->si_info;
    st->s_item = item;
    st->s_parent = (nni_stat *)0x0;
    for (item_00 = (nni_stat_item *)nni_list_first(&item->si_children);
        item_00 != (nni_stat_item *)0x0;
        item_00 = (nni_stat_item *)nni_list_next(&item->si_children,item_00)) {
      iVar2 = stat_make_tree(item_00,&local_40);
      pnVar1 = local_40;
      if (iVar2 != 0) {
        nng_stats_free(st);
        return iVar2;
      }
      nni_list_append(&st->s_children,local_40);
      pnVar1->s_parent = st;
    }
    cs->s_info = (nni_stat_info *)st;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
stat_make_tree(nni_stat_item *item, nni_stat **sp)
{
	nni_stat      *stat;
	nni_stat_item *child;

	if ((stat = NNI_ALLOC_STRUCT(stat)) == NULL) {
		return (NNG_ENOMEM);
	}
	NNI_LIST_INIT(&stat->s_children, nni_stat, s_node);

	stat->s_info   = item->si_info;
	stat->s_item   = item;
	stat->s_parent = NULL;

	NNI_LIST_FOREACH (&item->si_children, child) {
		nni_stat *cs;
		int       rv;
		if ((rv = stat_make_tree(child, &cs)) != 0) {
			nng_stats_free(stat);
			return (rv);
		}
		nni_list_append(&stat->s_children, cs);
		cs->s_parent = stat;
	}
	*sp = stat;
	return (0);
}